

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIDoubleValueImpl::~FIDoubleValueImpl(FIDoubleValueImpl *this)

{
  FIDoubleValueImpl *this_local;
  
  (this->super_FIDoubleValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__0111ac70;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIDoubleValue::~FIDoubleValue(&this->super_FIDoubleValue);
  return;
}

Assistant:

inline FIDoubleValueImpl(std::vector<double> &&value_): strValueValid(false) { value = std::move(value_); }